

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

ZoneHashNode * __thiscall asmjit::ZoneHashBase::_put(ZoneHashBase *this,ZoneHashNode *node)

{
  uint uVar1;
  uint32_t newCount;
  ZoneHashNode **ppZVar2;
  ZoneHashNode *pZVar3;
  uint32_t *puVar4;
  ulong uVar5;
  
  uVar1 = this->_bucketsCount;
  ppZVar2 = this->_data;
  pZVar3 = ppZVar2[(ulong)*(uint *)(node + 8) % (ulong)uVar1];
  *(ZoneHashNode **)node = pZVar3;
  ppZVar2[(ulong)*(uint *)(node + 8) % (ulong)uVar1] = node;
  uVar5 = this->_size + 1;
  this->_size = uVar5;
  if ((this->_bucketsGrow <= uVar5) && (pZVar3 != (ZoneHashNode *)0x0)) {
    puVar4 = &ZoneHash_getClosestPrime(unsigned_int)::primeTable;
    uVar5 = 0;
    do {
      newCount = *puVar4;
      if (8 < uVar5) break;
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + 1;
    } while (newCount <= uVar1);
    if (newCount != uVar1) {
      _rehash(this,newCount);
    }
  }
  return node;
}

Assistant:

ZoneHashNode* ZoneHashBase::_put(ZoneHashNode* node) noexcept {
  uint32_t hMod = node->_hVal % _bucketsCount;
  ZoneHashNode* next = _data[hMod];

  node->_hashNext = next;
  _data[hMod] = node;

  if (++_size >= _bucketsGrow && next) {
    uint32_t newCapacity = ZoneHash_getClosestPrime(_bucketsCount);
    if (newCapacity != _bucketsCount)
      _rehash(newCapacity);
  }

  return node;
}